

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  istream *piVar2;
  ostream *poVar3;
  size_t sVar4;
  void *this;
  int *piVar5;
  int local_4c;
  int local_48;
  int x;
  int i;
  undefined1 local_38 [8];
  queue<int> q;
  int b;
  int a;
  int n;
  
  a = 0;
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  CP::queue<int>::queue((queue<int> *)local_38);
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&b);
  piVar2 = (istream *)std::istream::operator>>(piVar2,(int *)((long)&q.mFront + 4));
  std::istream::operator>>(piVar2,(int *)&q.mFront);
  for (local_48 = 0; local_48 < b; local_48 = local_48 + 1) {
    std::istream::operator>>((istream *)&std::cin,&local_4c);
    CP::queue<int>::push((queue<int> *)local_38,&local_4c);
  }
  CP::queue<int>::reverse((queue<int> *)local_38,q.mFront._4_4_,(int)q.mFront);
  poVar3 = std::operator<<((ostream *)&std::cout,"size of q = ");
  sVar4 = CP::queue<int>::size((queue<int> *)local_38);
  this = (void *)std::ostream::operator<<(poVar3,sVar4);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  while( true ) {
    bVar1 = CP::queue<int>::empty((queue<int> *)local_38);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    piVar5 = CP::queue<int>::front((queue<int> *)local_38);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,*piVar5);
    std::operator<<(poVar3," ");
    CP::queue<int>::pop((queue<int> *)local_38);
  }
  CP::queue<int>::~queue((queue<int> *)local_38);
  return a;
}

Assistant:

int main() {
  std::ios_base::sync_with_stdio(false);cin.tie(0);

  int n,a,b;
  CP::queue<int> q;
  cin >> n >> a >> b;
  for (int i = 0;i < n;i++) {
    int x;
    cin >> x;
    q.push(x);
  }
  q.reverse(a,b);

  cout << "size of q = " << q.size() << endl;
  while (!q.empty()) {
    cout << q.front() << " ";
    q.pop();
  }
}